

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall Assimp::ASEImporter::BuildLights(ASEImporter *this)

{
  undefined8 uVar1;
  int iVar2;
  pointer pLVar3;
  pointer pLVar4;
  aiScene *paVar5;
  ulong __n;
  aiLight **ppaVar6;
  aiLight *this_00;
  long lVar7;
  uint i;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pLVar3 = (this->mParser->m_vLights).
           super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar4 = (this->mParser->m_vLights).
           super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar3 != pLVar4) {
    this->pcScene->mNumLights = (uint)(((long)pLVar4 - (long)pLVar3) / 0x170);
    paVar5 = this->pcScene;
    ppaVar6 = (aiLight **)operator_new__((ulong)paVar5->mNumLights << 3);
    paVar5->mLights = ppaVar6;
    lVar7 = 0x16c;
    for (uVar8 = 0; uVar8 < this->pcScene->mNumLights; uVar8 = uVar8 + 1) {
      this_00 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(this_00);
      this->pcScene->mLights[uVar8] = this_00;
      pLVar3 = (this->mParser->m_vLights).
               super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->mDirection).x = 0.0;
      (this_00->mDirection).y = 0.0;
      (this_00->mDirection).z = -1.0;
      __n = *(ulong *)((long)pLVar3 + lVar7 + -0x15c);
      if (__n < 0x400) {
        (this_00->mName).length = (ai_uint32)__n;
        memcpy((this_00->mName).data,*(void **)((long)pLVar3 + lVar7 + -0x164),__n);
        (this_00->mName).data[__n] = '\0';
      }
      iVar2 = *(int *)((long)pLVar3 + lVar7 + -0x18);
      if (iVar2 == 3) {
        this_00->mType = aiLightSource_DIRECTIONAL;
      }
      else if (iVar2 == 1) {
        this_00->mType = aiLightSource_SPOT;
        fVar10 = *(float *)((long)pLVar3 + lVar7 + -4) * 0.017453292;
        this_00->mAngleInnerCone = fVar10;
        fVar11 = *(float *)((long)&(pLVar3->super_BaseNode).mType + lVar7);
        uVar9 = -(uint)(fVar11 != 0.0);
        this_00->mAngleOuterCone =
             (float)(~uVar9 & (uint)fVar10 | (uint)(fVar11 * 0.017453292) & uVar9);
      }
      else {
        this_00->mType = aiLightSource_POINT;
      }
      uVar1 = *(undefined8 *)((long)pLVar3 + lVar7 + -0xc);
      fVar10 = (float)((ulong)uVar1 >> 0x20);
      fVar12 = fVar10 * *(float *)((long)pLVar3 + lVar7 + -0x14);
      fVar11 = *(float *)((long)pLVar3 + lVar7 + -0x10) * fVar10;
      fVar10 = fVar10 * (float)uVar1;
      (this_00->mColorSpecular).r = fVar12;
      (this_00->mColorSpecular).g = fVar11;
      (this_00->mColorSpecular).b = fVar10;
      (this_00->mColorDiffuse).r = fVar12;
      (this_00->mColorDiffuse).g = fVar11;
      (this_00->mColorDiffuse).b = fVar10;
      lVar7 = lVar7 + 0x170;
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildLights()
{
    if (!mParser->m_vLights.empty())    {
        pcScene->mNumLights = (unsigned int)mParser->m_vLights.size();
        pcScene->mLights    = new aiLight*[pcScene->mNumLights];

        for (unsigned int i = 0; i < pcScene->mNumLights;++i)   {
            aiLight* out = pcScene->mLights[i] = new aiLight();
            ASE::Light& in = mParser->m_vLights[i];

            // The direction is encoded in the transformation matrix of the node.
            // In 3DS MAX the light source points into negative Z direction if
            // the node transformation is the identity.
            out->mDirection = aiVector3D(0.f,0.f,-1.f);

            out->mName.Set(in.mName);
            switch (in.mLightType)
            {
            case ASE::Light::TARGET:
                out->mType = aiLightSource_SPOT;
                out->mAngleInnerCone = AI_DEG_TO_RAD(in.mAngle);
                out->mAngleOuterCone = (in.mFalloff ? AI_DEG_TO_RAD(in.mFalloff) : out->mAngleInnerCone);
                break;

            case ASE::Light::DIRECTIONAL:
                out->mType = aiLightSource_DIRECTIONAL;
                break;

            default:
            //case ASE::Light::OMNI:
                out->mType = aiLightSource_POINT;
                break;
            };
            out->mColorDiffuse = out->mColorSpecular = in.mColor * in.mIntensity;
        }
    }
}